

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_string_ex(rf_font font,char *text,int text_len,rf_vec2 position,float font_size,
                      float spacing,rf_color tint)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  long lVar4;
  rf_int rVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  rf_int rVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  rf_rec source_rec;
  rf_rec dest_rec;
  float local_58;
  float fStack_54;
  rf_decoded_rune decoded_rune;
  
  fVar13 = font_size / (float)font.base_size;
  lVar8 = 0;
  rVar5 = font.glyphs_count;
  if (font.glyphs_count < 1) {
    rVar5 = lVar8;
  }
  fVar14 = 0.0;
  iVar10 = 0;
  do {
    lVar6 = text_len - lVar8;
    if (lVar6 == 0 || text_len < lVar8) {
      return;
    }
    rf_decode_utf8_char(&decoded_rune,text + lVar8,lVar6);
    lVar6 = 0;
    lVar4 = rVar5;
    piVar7 = &(font.glyphs)->codepoint;
    while (bVar11 = lVar4 != 0, lVar4 = lVar4 + -1, bVar11) {
      if (*piVar7 == decoded_rune.codepoint) {
        lVar6 = lVar6 >> 0x20;
        goto LAB_00149a24;
      }
      lVar6 = lVar6 + 0x100000000;
      piVar7 = piVar7 + 8;
    }
    lVar6 = -1;
LAB_00149a24:
    rVar9 = 1;
    if (decoded_rune.codepoint == 0x3f) {
LAB_00149a54:
      uVar2 = *(undefined8 *)((long)&font.glyphs[lVar6].field_0 + 8);
      local_58 = position.x;
      fStack_54 = position.y;
      uVar1 = font.glyphs[lVar6].offset_x;
      uVar3 = font.glyphs[lVar6].offset_y;
      dest_rec.x = (float)(int)uVar1 * fVar13 + fVar14 + local_58;
      dest_rec.y = (float)(int)uVar3 * fVar13 + (float)iVar10 + fStack_54;
      dest_rec.width = fVar13 * (float)uVar2;
      dest_rec.height = fVar13 * (float)((ulong)uVar2 >> 0x20);
      source_rec.width = (float)(int)uVar2;
      source_rec.height = (float)(int)((ulong)uVar2 >> 0x20);
      source_rec._0_8_ = *(undefined8 *)&font.glyphs[lVar6].field_0;
      rf_draw_texture_region(font.texture,source_rec,dest_rec,(rf_vec2)0x0,0.0,tint);
LAB_00149adc:
      if (font.glyphs[lVar6].advance_x == 0) {
        fVar12 = font.glyphs[lVar6].field_0.rec.width;
      }
      else {
        fVar12 = (float)font.glyphs[lVar6].advance_x;
      }
      fVar14 = fVar14 + fVar12 * fVar13 + spacing;
    }
    else {
      rVar9 = decoded_rune.bytes_processed;
      if (decoded_rune.codepoint == 0x20) goto LAB_00149adc;
      if (decoded_rune.codepoint != 10) goto LAB_00149a54;
      iVar10 = iVar10 + (int)((float)(font.base_size / 2 + font.base_size) * fVar13);
      fVar14 = 0.0;
    }
    lVar8 = lVar8 + rVar9;
  } while( true );
}

Assistant:

RF_API void rf_draw_string_ex(rf_font font, const char* text, int text_len, rf_vec2 position, float font_size, float spacing, rf_color tint)
{
    int text_offset_y = 0; // Required for line break!
    float text_offset_x = 0.0f; // Offset between characters
    float scale_factor = 0.0f;

    int letter = 0; // Current character
    int index  = 0; // Index position in sprite font

    scale_factor = font_size / font.base_size;

    for (rf_int i = 0; i < text_len; i++)
    {
        rf_decoded_rune decoded_rune = rf_decode_utf8_char(&text[i], text_len - i);
        letter = decoded_rune.codepoint;
        index = rf_get_glyph_index(font, letter);

        // NOTE: Normally we exit the decoding sequence as soon as a bad unsigned char is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set 'next = 1'
        if (letter == 0x3f) decoded_rune.bytes_processed = 1;
        i += (decoded_rune.bytes_processed - 1);

        if (letter == '\n')
        {
            // NOTE: Fixed line spacing of 1.5 lines
            text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
            text_offset_x = 0.0f;
        }
        else
        {
            if (letter != ' ')
            {
                rf_rec src_rec = font.glyphs[index].rec;
                rf_rec dst_rec = {  position.x + text_offset_x + font.glyphs[index].offset_x * scale_factor,
                                    position.y + text_offset_y + font.glyphs[index].offset_y * scale_factor,
                                    font.glyphs[index].width  * scale_factor,
                                    font.glyphs[index].height * scale_factor };
                rf_draw_texture_region(font.texture, src_rec, dst_rec, (rf_vec2){0}, 0.0f, tint);
            }

            if (font.glyphs[index].advance_x == 0) text_offset_x += ((float)font.glyphs[index].width * scale_factor + spacing);
            else text_offset_x += ((float)font.glyphs[index].advance_x * scale_factor + spacing);
        }
    }
}